

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Bitmap.cxx
# Opt level: O0

void __thiscall Fl_Bitmap::uncache(Fl_Bitmap *this)

{
  Fl_Bitmap *this_local;
  
  if (this->id_ != 0) {
    fl_delete_bitmask((ulong)this->id_);
    this->id_ = 0;
  }
  return;
}

Assistant:

void Fl_Bitmap::uncache() {
  if (id_) {
#ifdef __APPLE_QUARTZ__
    fl_delete_bitmask((Fl_Bitmask)id_);
#else
    fl_delete_bitmask((Fl_Offscreen)id_);
#endif
    id_ = 0;
  }
}